

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

bool QFile::moveToTrash(QString *fileName,QString *pathInTrash)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  QFile local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_28.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile(&local_28,fileName);
  bVar4 = moveToTrash(&local_28);
  if (bVar4 && pathInTrash != (QString *)0x0) {
    QFile::fileName((QString *)&local_48,&local_28);
    pDVar2 = (pathInTrash->d).d;
    pcVar3 = (pathInTrash->d).ptr;
    (pathInTrash->d).d = local_48.d;
    (pathInTrash->d).ptr = local_48.ptr;
    qVar1 = (pathInTrash->d).size;
    (pathInTrash->d).size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  ~QFile(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::moveToTrash(const QString &fileName, QString *pathInTrash)
{
    QFile file(fileName);
    if (file.moveToTrash()) {
        if (pathInTrash)
            *pathInTrash = file.fileName();
        return true;
    }
    return false;
}